

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeSpan.h
# Opt level: O0

void __thiscall
TimeSpan::CalculateTicks(TimeSpan *this,int days,int hours,int minutes,int seconds,int microseconds)

{
  int microseconds_local;
  int seconds_local;
  int minutes_local;
  int hours_local;
  int days_local;
  TimeSpan *this_local;
  
  this->m_ticks =
       (long)days * 86400000000 +
       ((long)hours * 0xe10 + (long)minutes * 0x3c + (long)seconds) * 1000000 + (long)microseconds;
  return;
}

Assistant:

void CalculateTicks(int days,
            int hours,
            int minutes,
            int seconds,
            int microseconds)
    {
        m_ticks = days * TicksPerDay +
            (hours * 3600LL + minutes * 60LL + seconds) * TicksPerSecond + 
            microseconds * TicksPerMicrosecond;
    }